

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

QFileDialog * __thiscall QFileDialog::directory(QFileDialog *this)

{
  QDialogPrivate *this_00;
  undefined1 *puVar1;
  QPlatformDialogHelper *pQVar2;
  long in_RSI;
  long in_FS_OFFSET;
  QUrl QStack_68;
  QUrl local_60;
  char16_t *local_58;
  undefined1 *local_50;
  QArrayData *local_48;
  char16_t *pcStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDialogPrivate **)(in_RSI + 8);
  if (this_00->nativeDialogInUse == true) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_40 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = QDialogPrivate::platformHelper(this_00);
    if (pQVar2 == (QPlatformDialogHelper *)0x0) {
      QUrl::QUrl(&local_60);
    }
    else {
      (**(code **)(*(long *)pQVar2 + 0x90))(&local_60,pQVar2);
    }
    QUrl::toLocalFile();
    QUrl::~QUrl(&local_60);
    puVar1 = local_38;
    if (local_38 == (undefined1 *)0x0) {
      QFileDialogOptions::initialDirectory();
      QUrl::toLocalFile();
    }
    else {
      local_60.d = (QUrlPrivate *)local_48;
      local_58 = pcStack_40;
      local_50 = local_38;
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    QDir::QDir((QDir *)this,(QString *)&local_60);
    if ((QArrayData *)local_60.d != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_60.d = *(int *)local_60.d + -1;
      UNLOCK();
      if (*(int *)local_60.d == 0) {
        QArrayData::deallocate((QArrayData *)local_60.d,2,0x10);
      }
    }
    if (puVar1 == (undefined1 *)0x0) {
      QUrl::~QUrl(&QStack_68);
    }
  }
  else {
    if (*(long *)&this_00[1].super_QWidgetPrivate.field_0x20 == 0) {
      local_48 = (QArrayData *)0x0;
      pcStack_40 = L"/";
      local_38 = (undefined1 *)0x1;
    }
    else {
      QFileSystemModel::rootPath();
    }
    QDir::QDir((QDir *)this,(QString *)&local_48);
  }
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QDir QFileDialog::directory() const
{
    Q_D(const QFileDialog);
    if (d->nativeDialogInUse) {
        QString dir = d->directory_sys().toLocalFile();
        return QDir(dir.isEmpty() ? d->options->initialDirectory().toLocalFile() : dir);
    }
    return d->rootPath();
}